

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

Test * testing::internal::
       HandleExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                 (TestFactoryBase *object,offset_in_TestFactoryBase_to_subr method,char *location)

{
  long lVar1;
  bool bVar2;
  UnitTestImpl *this;
  long in_FS_OFFSET;
  code *local_e8;
  AssertionException *anon_var_0;
  GoogleTestFailureException *anon_var_0_1;
  exception *e;
  char *location_local;
  offset_in_TestFactoryBase_to_subr method_local;
  TestFactoryBase *object_local;
  Test *local_58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = GetUnitTestImpl();
  bVar2 = UnitTestImpl::catch_exceptions(this);
  if (bVar2) {
    local_58 = HandleSehExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                         (object,method,location);
  }
  else {
    local_e8 = (code *)method;
    if ((method & 1) != 0) {
      local_e8 = *(code **)(*(long *)(location + (long)&object->_vptr_TestFactoryBase) +
                           (method - 1));
    }
    local_58 = (Test *)(*local_e8)(location + (long)&object->_vptr_TestFactoryBase);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

Result HandleExceptionsInMethodIfSupported(
    T* object, Result (T::*method)(), const char* location) {
  // NOTE: The user code can affect the way in which Google Test handles
  // exceptions by setting GTEST_FLAG(catch_exceptions), but only before
  // RUN_ALL_TESTS() starts. It is technically possible to check the flag
  // after the exception is caught and either report or re-throw the
  // exception based on the flag's value:
  //
  // try {
  //   // Perform the test method.
  // } catch (...) {
  //   if (GTEST_FLAG(catch_exceptions))
  //     // Report the exception as failure.
  //   else
  //     throw;  // Re-throws the original exception.
  // }
  //
  // However, the purpose of this flag is to allow the program to drop into
  // the debugger when the exception is thrown. On most platforms, once the
  // control enters the catch block, the exception origin information is
  // lost and the debugger will stop the program at the point of the
  // re-throw in this function -- instead of at the point of the original
  // throw statement in the code under test.  For this reason, we perform
  // the check early, sacrificing the ability to affect Google Test's
  // exception handling in the method where the exception is thrown.
  if (internal::GetUnitTestImpl()->catch_exceptions()) {
#if GTEST_HAS_EXCEPTIONS
    try {
      return HandleSehExceptionsInMethodIfSupported(object, method, location);
    } catch (const AssertionException&) {  // NOLINT
      // This failure was reported already.
    } catch (const internal::GoogleTestFailureException&) {  // NOLINT
      // This exception type can only be thrown by a failed Google
      // Test assertion with the intention of letting another testing
      // framework catch it.  Therefore we just re-throw it.
      throw;
    } catch (const std::exception& e) {  // NOLINT
      internal::ReportFailureInUnknownLocation(
          TestPartResult::kFatalFailure,
          FormatCxxExceptionMessage(e.what(), location));
    } catch (...) {  // NOLINT
      internal::ReportFailureInUnknownLocation(
          TestPartResult::kFatalFailure,
          FormatCxxExceptionMessage(NULL, location));
    }
    return static_cast<Result>(0);
#else
    return HandleSehExceptionsInMethodIfSupported(object, method, location);
#endif  // GTEST_HAS_EXCEPTIONS
  } else {
    return (object->*method)();
  }
}